

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

int drop_throw(monst *magr,obj *obj,obj *ostack,boolean thrown,boolean ohit,int x,int y)

{
  schar sVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  trap *ptVar5;
  bool bVar6;
  monst *local_68;
  obj *local_60;
  int objgone;
  obj *monwep;
  trap *t;
  monst *mtmp;
  int create;
  int retvalu;
  int x_local;
  boolean ohit_local;
  boolean thrown_local;
  obj *ostack_local;
  obj *obj_local;
  monst *magr_local;
  
  if (magr == (monst *)0x0) {
    local_60 = (obj *)0x0;
  }
  else {
    local_60 = magr->mw;
  }
  if (((obj->otyp == 0x120) || (obj->oclass == '\x11')) || ((ohit != '\0' && (obj->otyp == 0x10f))))
  {
    bVar6 = false;
  }
  else if ((ohit == '\0') ||
          ((((obj->oclass != '\x02' || (objects[obj->otyp].oc_subtyp < -0x1a)) ||
            (-0x16 < objects[obj->otyp].oc_subtyp)) && (obj->otyp != 0x213)))) {
    bVar6 = true;
  }
  else {
    iVar4 = rn2(3);
    bVar6 = iVar4 == 0;
  }
  if (bVar6) {
    if ((level->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_68 = (monst *)0x0;
    }
    else {
      local_68 = level->monsters[x][y];
    }
    t = (trap *)local_68;
    if (((local_68 == (monst *)0x0) || ((*(uint *)&local_68->field_0x60 >> 0x17 & 1) == 0)) ||
       ((ptVar5 = t_at(level,x,y), ptVar5 == (trap *)0x0 ||
        (((ptVar5->field_0x8 & 0x1f) != 0xb && ((ptVar5->field_0x8 & 0x1f) != 0xc)))))) {
      cVar2 = '\0';
      sVar1 = down_gate((xchar)x,(xchar)y);
      if (sVar1 != -1) {
        cVar2 = ship_object(obj,(xchar)x,(xchar)y,'\0');
      }
      if (cVar2 != '\0') {
        return 1;
      }
      bVar3 = flooreffects(obj,x,y,"fall");
      if (bVar3 != '\0') {
        return 1;
      }
      bVar3 = detonate_obj(obj,ostack,local_60,x,y,thrown);
      if (bVar3 == '\0') {
        place_object(obj,level,x,y);
        if (((local_68 == (monst *)0x0) && (x == u.ux)) && (y == u.uy)) {
          t = (trap *)&youmonst;
        }
        if ((t != (trap *)0x0) && (ohit != '\0')) {
          passive_obj((monst *)t,obj,(attack *)0x0);
        }
        stackobj(obj);
        return 0;
      }
      return 1;
    }
  }
  bVar3 = detonate_obj(obj,ostack,local_60,x,y,thrown);
  if (bVar3 == '\0') {
    obfree(obj,(obj *)0x0);
    return 1;
  }
  return 1;
}

Assistant:

static int drop_throw(struct monst *magr, struct obj *obj, struct obj *ostack,
		      boolean thrown, boolean ohit, int x, int y)
{
	int retvalu = 1;
	int create;
	struct monst *mtmp;
	struct trap *t;
	struct obj *monwep = (magr ? MON_WEP(magr) : NULL);

	if (obj->otyp == CREAM_PIE || obj->oclass == VENOM_CLASS ||
		    (ohit && obj->otyp == EGG))
		create = 0;
	else if (ohit && (is_multigen(obj) || obj->otyp == ROCK))
		create = !rn2(3);
	else create = 1;

	if (create && !((mtmp = m_at(level, x, y)) && (mtmp->mtrapped) &&
			(t = t_at(level, x, y)) && ((t->ttyp == PIT) ||
			(t->ttyp == SPIKED_PIT)))) {
		int objgone = 0;

		if (down_gate(x, y) != -1)
			objgone = ship_object(obj, x, y, FALSE);
		if (!objgone) {
			if (!flooreffects(obj,x,y,"fall")) { /* don't double-dip on damage */
			    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
				return 1;
			    place_object(obj, level, x, y);
			    if (!mtmp && x == u.ux && y == u.uy)
				mtmp = &youmonst;
			    if (mtmp && ohit)
				passive_obj(mtmp, obj, NULL);
			    stackobj(obj);
			    retvalu = 0;
			}
		}
	} else {
	    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
		return 1;
	    obfree(obj, NULL);
	}

	return retvalu;
}